

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O3

QString * QMakeEvaluator::formatValueListList
                    (QString *__return_storage_ptr__,QList<ProStringList> *lists)

{
  long lVar1;
  ProStringList *list;
  ProStringList *vals;
  long in_FS_OFFSET;
  QLatin1String QVar2;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  lVar1 = (lists->d).size;
  if (lVar1 != 0) {
    vals = (lists->d).ptr;
    lVar1 = lVar1 * 0x18;
    do {
      if ((__return_storage_ptr__->d).size != 0) {
        QVar2.m_data = (char *)0x2;
        QVar2.m_size = (qsizetype)__return_storage_ptr__;
        QString::append(QVar2);
      }
      formatValueList(&local_48,vals,false);
      QString::append((QString *)__return_storage_ptr__);
      if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
        }
      }
      vals = vals + 1;
      lVar1 = lVar1 + -0x18;
    } while (lVar1 != 0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QMakeEvaluator::formatValueListList(const QList<ProStringList> &lists)
{
    QString ret;

    for (const ProStringList &list : lists) {
        if (!ret.isEmpty())
            ret += QLatin1String(", ");
        ret += formatValueList(list);
    }
    return ret;
}